

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int * Fra_SmlCountOnes(Fra_Sml_t *p)

{
  int iVar1;
  int *__s;
  void *pvVar2;
  int *pnBits;
  int i;
  Aig_Obj_t *pObj;
  Fra_Sml_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAig);
  __s = (int *)malloc((long)iVar1 << 2);
  iVar1 = Aig_ManObjNumMax(p->pAig);
  memset(__s,0,(long)iVar1 << 2);
  for (pnBits._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), pnBits._4_4_ < iVar1;
      pnBits._4_4_ = pnBits._4_4_ + 1) {
    pvVar2 = Vec_PtrEntry(p->pAig->vObjs,pnBits._4_4_);
    if (pvVar2 != (void *)0x0) {
      iVar1 = Fra_SmlCountOnesOne(p,pnBits._4_4_);
      __s[pnBits._4_4_] = iVar1;
    }
  }
  return __s;
}

Assistant:

static inline int * Fra_SmlCountOnes( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i, * pnBits; 
    pnBits = ABC_ALLOC( int, Aig_ManObjNumMax(p->pAig) );  
    memset( pnBits, 0, sizeof(int) * Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
        pnBits[i] = Fra_SmlCountOnesOne( p, i );
    return pnBits;
}